

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O3

Instance * parse(Instance *__return_storage_ptr__,char *filepath)

{
  uint uVar1;
  int32_t *piVar2;
  Vec2d *pVVar3;
  _Bool _Var4;
  int iVar5;
  FILE *__stream;
  char *pcVar6;
  long lVar7;
  ulong uVar8;
  uint uVar9;
  int32_t idx;
  double demand;
  double y;
  double x;
  uint local_5c;
  double local_58;
  double local_50;
  double local_48;
  double local_40;
  int32_t *local_38;
  
  __stream = fopen(filepath,"r");
  __return_storage_ptr__->name = (char *)0x0;
  __return_storage_ptr__->comment = (char *)0x0;
  __return_storage_ptr__->num_customers = 0;
  __return_storage_ptr__->num_vehicles = 0;
  __return_storage_ptr__->vehicle_cap = 0.0;
  *(undefined8 *)&__return_storage_ptr__->rounding_strat = 0;
  __return_storage_ptr__->positions = (Vec2d *)0x0;
  __return_storage_ptr__->demands = (double *)0x0;
  __return_storage_ptr__->profits = (double *)0x0;
  __return_storage_ptr__->edge_weight = (double *)0x0;
  pcVar6 = os_get_fext(filepath);
  if (pcVar6 == (char *)0x0) {
    if (__stream == (FILE *)0x0) goto LAB_00104591;
  }
  else {
    if (__stream == (FILE *)0x0) goto LAB_00104591;
    iVar5 = strcmp(pcVar6,"simplified-vrp");
    if (iVar5 == 0) {
      piVar2 = &__return_storage_ptr__->num_customers;
      iVar5 = __isoc99_fscanf(__stream,"%d %d %lf",piVar2,&__return_storage_ptr__->num_vehicles,
                              &__return_storage_ptr__->vehicle_cap);
      if (iVar5 == 3) {
        _Var4 = expect_newline((FILE *)__stream,filepath,1);
        if (_Var4) {
          _Var4 = prep_memory(__return_storage_ptr__);
          if (!_Var4) {
            uVar8 = (ulong)(uint)*piVar2;
            pcVar6 = "%s: Failed to allocate memory for %d customers\n";
            goto LAB_00104562;
          }
          uVar9 = 0xffffffff;
          local_38 = piVar2;
          while( true ) {
            local_5c = 0;
            local_40 = 0.0;
            local_48 = 0.0;
            local_50 = 0.0;
            local_58 = 0.0;
            iVar5 = __isoc99_fscanf(__stream,"%d %lf %lf %lf %lf",&local_5c,&local_40,&local_48,
                                    &local_50,&local_58);
            if (iVar5 != 5) break;
            uVar1 = uVar9 + 1;
            if (uVar1 != local_5c) {
              fprintf(_stderr,"%s: Parsing error at line %d. Expected idx %d but found %d\n",
                      filepath,(ulong)(uVar9 + 3),(ulong)uVar1);
              goto LAB_00104501;
            }
            _Var4 = expect_newline((FILE *)__stream,filepath,uVar9 + 3);
            if (!_Var4) goto LAB_00104501;
            pVVar3 = __return_storage_ptr__->positions;
            lVar7 = (long)(int)local_5c;
            pVVar3[lVar7].x = local_40;
            pVVar3[lVar7].y = local_48;
            __return_storage_ptr__->demands[lVar7] = local_50;
            __return_storage_ptr__->profits[lVar7] = local_58;
            uVar9 = uVar1;
          }
          if (iVar5 != -1) {
            fprintf(_stderr,"%s: Parsing error at line %d\n",filepath);
          }
LAB_00104501:
          if (*local_38 == uVar9) {
            fclose(__stream);
            goto LAB_00104515;
          }
          fprintf(_stderr,"%s: Expected %d customers but found %d\n",filepath,(ulong)(uint)*local_38
                  ,(ulong)uVar9);
        }
      }
      else {
        pcVar6 = "%s: Parsing error at line %d\n";
        uVar8 = 1;
LAB_00104562:
        fprintf(_stderr,pcVar6,filepath,uVar8);
      }
      fclose(__stream);
      goto LAB_00104591;
    }
  }
  _Var4 = parse_vrp_file(__return_storage_ptr__,(FILE *)__stream,filepath);
  fclose(__stream);
  if (_Var4) {
LAB_00104515:
    if ((__return_storage_ptr__->name != (char *)0x0) && (*__return_storage_ptr__->name != '\0')) {
      return __return_storage_ptr__;
    }
    instance_set_name(__return_storage_ptr__,filepath);
    return __return_storage_ptr__;
  }
LAB_00104591:
  instance_destroy(__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

Instance parse(const char *filepath) {
    return parse_impl(filepath, PARSING_FILE_EXT_AUTODETECT);
}